

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::MergeFrom
          (CustomModel_CustomModelParamValue *this,CustomModel_CustomModelParamValue *from)

{
  uint32_t uVar1;
  int32_t iVar2;
  ulong uVar3;
  LogMessage *other;
  undefined8 *puVar4;
  undefined8 *puVar5;
  ValueUnion VVar6;
  LogFinisher local_61;
  ValueUnion local_60;
  LogMessage local_58;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/CustomModel.pb.cc"
               ,0x181);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_61,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  uVar1 = from->_oneof_case_[0];
  if ((int)uVar1 < 0x28) {
    if (uVar1 == 10) {
      if (uVar1 == 10) {
        VVar6 = from->value_;
      }
      else {
        VVar6.doublevalue_ = 0.0;
      }
      if (this->_oneof_case_[0] != 10) {
        local_60 = VVar6;
        clear_value(this);
        this->_oneof_case_[0] = 10;
        VVar6 = local_60;
      }
      (this->value_).doublevalue_ = (double)VVar6;
      goto LAB_0033c6c6;
    }
    if (uVar1 != 0x14) {
      if (uVar1 == 0x1e) {
        iVar2 = (from->value_).intvalue_;
        if (this->_oneof_case_[0] != 0x1e) {
          clear_value(this);
          this->_oneof_case_[0] = 0x1e;
        }
        (this->value_).intvalue_ = iVar2;
      }
      goto LAB_0033c6c6;
    }
    if (uVar1 == 0x14) {
      puVar5 = (undefined8 *)((from->value_).longvalue_ & 0xfffffffffffffffe);
    }
    else {
      puVar5 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    if (this->_oneof_case_[0] != 0x14) {
      clear_value(this);
      this->_oneof_case_[0] = 0x14;
LAB_0033c6a0:
      (this->value_).doublevalue_ =
           (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
  }
  else {
    if (uVar1 == 0x28) {
      if (uVar1 == 0x28) {
        VVar6 = from->value_;
      }
      else {
        VVar6.doublevalue_ = 0.0;
      }
      if (this->_oneof_case_[0] != 0x28) {
        clear_value(this);
        this->_oneof_case_[0] = 0x28;
      }
      this->value_ = VVar6;
      goto LAB_0033c6c6;
    }
    if (uVar1 == 0x32) {
      iVar2 = (from->value_).intvalue_;
      if (this->_oneof_case_[0] != 0x32) {
        clear_value(this);
        this->_oneof_case_[0] = 0x32;
      }
      (this->value_).boolvalue_ = SUB41(iVar2,0);
      goto LAB_0033c6c6;
    }
    if (uVar1 != 0x3c) goto LAB_0033c6c6;
    if (uVar1 == 0x3c) {
      puVar5 = (undefined8 *)((from->value_).longvalue_ & 0xfffffffffffffffe);
    }
    else {
      puVar5 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    if (this->_oneof_case_[0] != 0x3c) {
      clear_value(this);
      this->_oneof_case_[0] = 0x3c;
      goto LAB_0033c6a0;
    }
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar4 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
  if ((uVar3 & 1) != 0) {
    puVar4 = (undefined8 *)*puVar4;
  }
  google::protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)&this->value_,puVar5,puVar4);
LAB_0033c6c6:
  uVar3 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar3 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void CustomModel_CustomModelParamValue::MergeFrom(const CustomModel_CustomModelParamValue& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CustomModel.CustomModelParamValue)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.value_case()) {
    case kDoubleValue: {
      _internal_set_doublevalue(from._internal_doublevalue());
      break;
    }
    case kStringValue: {
      _internal_set_stringvalue(from._internal_stringvalue());
      break;
    }
    case kIntValue: {
      _internal_set_intvalue(from._internal_intvalue());
      break;
    }
    case kLongValue: {
      _internal_set_longvalue(from._internal_longvalue());
      break;
    }
    case kBoolValue: {
      _internal_set_boolvalue(from._internal_boolvalue());
      break;
    }
    case kBytesValue: {
      _internal_set_bytesvalue(from._internal_bytesvalue());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}